

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_add(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  
  (el->el_map).current = (el->el_map).key;
  pwVar2 = (el->el_line).cursor;
  pwVar1 = (el->el_line).lastchar;
  if (pwVar2 < pwVar1) {
    pwVar2 = pwVar2 + 1;
    if (pwVar1 < pwVar2) {
      pwVar2 = pwVar1;
    }
    (el->el_line).cursor = pwVar2;
    eVar3 = '\x05';
  }
  else {
    eVar3 = '\0';
  }
  cv_undo(el);
  return eVar3;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_add(EditLine *el, wint_t c __attribute__((__unused__)))
{
	int ret;

	el->el_map.current = el->el_map.key;
	if (el->el_line.cursor < el->el_line.lastchar) {
		el->el_line.cursor++;
		if (el->el_line.cursor > el->el_line.lastchar)
			el->el_line.cursor = el->el_line.lastchar;
		ret = CC_CURSOR;
	} else
		ret = CC_NORM;

	cv_undo(el);

	return (el_action_t)ret;
}